

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclaredType.cpp
# Opt level: O1

bool slang::ast::isValidForUserDefinedNet(Type *type)

{
  Type *pTVar1;
  SyntaxNode *pSVar2;
  bool bVar3;
  bool bVar4;
  Type *pTVar5;
  long lVar6;
  
  while( true ) {
    if (type->canonical == (Type *)0x0) {
      Type::resolveCanonical(type);
    }
    pTVar5 = type->canonical;
    bVar3 = Type::isIntegral(pTVar5);
    if (bVar3) {
      return true;
    }
    if (pTVar5->canonical == (Type *)0x0) {
      Type::resolveCanonical(pTVar5);
    }
    if ((pTVar5->canonical->super_Symbol).kind == FloatingType) break;
    if ((pTVar5->super_Symbol).kind != FixedSizeUnpackedArrayType) {
      if ((pTVar5->canonical->super_Symbol).kind == UnpackedStructType) {
        pTVar1 = pTVar5[1].canonical;
        bVar3 = pTVar1 == (Type *)0x0;
        if (!bVar3) {
          pSVar2 = pTVar5[1].super_Symbol.originatingSyntax;
          pTVar5 = DeclaredType::getType((DeclaredType *)(*(long *)pSVar2 + 0x40));
          bVar4 = isValidForUserDefinedNet(pTVar5);
          if (bVar4) {
            lVar6 = 8;
            do {
              bVar3 = (long)pTVar1 << 3 == lVar6;
              if (bVar3) {
                return bVar3;
              }
              pTVar5 = DeclaredType::getType
                                 ((DeclaredType *)(*(long *)((long)&pSVar2->kind + lVar6) + 0x40));
              bVar4 = isValidForUserDefinedNet(pTVar5);
              lVar6 = lVar6 + 8;
            } while (bVar4);
          }
        }
      }
      else if ((pTVar5->canonical->super_Symbol).kind == UnpackedUnionType) {
        pTVar1 = pTVar5[1].canonical;
        bVar3 = pTVar1 == (Type *)0x0;
        if (!bVar3) {
          pSVar2 = pTVar5[1].super_Symbol.originatingSyntax;
          pTVar5 = DeclaredType::getType((DeclaredType *)(*(long *)pSVar2 + 0x40));
          bVar4 = isValidForUserDefinedNet(pTVar5);
          if (bVar4) {
            lVar6 = 8;
            do {
              bVar3 = (long)pTVar1 << 3 == lVar6;
              if (bVar3) {
                return bVar3;
              }
              pTVar5 = DeclaredType::getType
                                 ((DeclaredType *)(*(long *)((long)&pSVar2->kind + lVar6) + 0x40));
              bVar4 = isValidForUserDefinedNet(pTVar5);
              lVar6 = lVar6 + 8;
            } while (bVar4);
          }
        }
      }
      else {
        bVar3 = false;
      }
      return bVar3;
    }
    type = *(Type **)&pTVar5[1].super_Symbol;
  }
  return true;
}

Assistant:

static bool isValidForUserDefinedNet(const Type& type) {
    auto& ct = type.getCanonicalType();
    if (ct.isIntegral() || ct.isFloating())
        return true;

    if (ct.kind == SymbolKind::FixedSizeUnpackedArrayType)
        return isValidForUserDefinedNet(ct.as<FixedSizeUnpackedArrayType>().elementType);

    if (ct.isUnpackedStruct()) {
        for (auto field : ct.as<UnpackedStructType>().fields) {
            if (!isValidForUserDefinedNet(field->getType()))
                return false;
        }
        return true;
    }

    if (ct.isUnpackedUnion()) {
        for (auto field : ct.as<UnpackedUnionType>().fields) {
            if (!isValidForUserDefinedNet(field->getType()))
                return false;
        }
        return true;
    }

    return false;
}